

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::CovergroupBodySymbol>
          (ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *this,
          CovergroupBodySymbol *t)

{
  DeclaredType *this_00;
  Expression *this_01;
  iterator this_02;
  Symbol *member;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  
  this_00 = Symbol::getDeclaredType(&t->super_Symbol);
  if (this_00 != (DeclaredType *)0x0) {
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visit<only_assigned_on_reset::MainVisitor&>(this_01,(AlwaysFFVisitor *)this);
    }
  }
  sVar1 = Scope::members(&t->super_Scope);
  for (this_02 = sVar1._M_begin.current; this_02.current != sVar1._M_end.current.current;
      this_02.current = (this_02.current)->nextInScope) {
    Symbol::visit<only_assigned_on_reset::MainVisitor&>(this_02.current,(AlwaysFFVisitor *)this);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }